

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O0

void __thiscall
gl4cts::StencilTexturing::FunctionalTest::draw
          (FunctionalTest *this,GLuint program_id,GLuint dst_texture_id,GLuint src_texture_id)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  exception *exc;
  int local_30;
  undefined4 local_2c;
  GLuint vao_id;
  GLint uni_sampler_loc;
  Functions *gl;
  GLuint fb_id;
  GLuint src_texture_id_local;
  GLuint dst_texture_id_local;
  GLuint program_id_local;
  FunctionalTest *this_local;
  
  gl._0_4_ = 0;
  gl._4_4_ = src_texture_id;
  fb_id = dst_texture_id;
  src_texture_id_local = program_id;
  _dst_texture_id_local = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _vao_id = CONCAT44(extraout_var,iVar1);
  local_2c = 0xffffffff;
  local_30 = 0;
  (**(code **)(_vao_id + 0xfd8))(0x8e72,1);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"PatchParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2d6);
  (**(code **)(_vao_id + 0x708))(1,&local_30);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2da);
  (**(code **)(_vao_id + 0xd8))(local_30);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2dd);
  (**(code **)(_vao_id + 0x6d0))(1,&gl);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"GenFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2e1);
  (**(code **)(_vao_id + 0x78))(0x8ca9,(int)gl);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2e4);
  (**(code **)(_vao_id + 0x690))(0x8ca9,0x8ce0,fb_id,0);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"FramebufferTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2e7);
  (**(code **)(_vao_id + 0x1a00))(0,0,8);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"Viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2ea);
  (**(code **)(_vao_id + 0x1680))(src_texture_id_local);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2ee);
  local_2c = (**(code **)(_vao_id + 0xb48))(src_texture_id_local,"uni_sampler");
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2f2);
  (**(code **)(_vao_id + 8))(0x84c1);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"ActiveTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2f5);
  (**(code **)(_vao_id + 0xb8))(0xde1,gl._4_4_);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2f8);
  (**(code **)(_vao_id + 0x14f0))(local_2c,1);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2fb);
  (**(code **)(_vao_id + 0x538))(0xe,0,1);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2ff);
  (**(code **)(_vao_id + 0xdb8))(0xffffffff);
  dVar2 = (**(code **)(_vao_id + 0x800))();
  glu::checkError(dVar2,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x303);
  (**(code **)(_vao_id + 0xd8))(0);
  (**(code **)(_vao_id + 0x78))(0x8ca9,0);
  (**(code **)(_vao_id + 0xb8))(0xde1,0);
  if (local_30 != 0) {
    (**(code **)(_vao_id + 0x490))(1,&local_30);
  }
  if ((int)gl != 0) {
    (**(code **)(_vao_id + 0x440))(1,&gl);
  }
  return;
}

Assistant:

void FunctionalTest::draw(GLuint program_id, GLuint dst_texture_id, GLuint src_texture_id)
{
	GLuint			 fb_id			 = 0;
	const Functions& gl				 = m_context.getRenderContext().getFunctions();
	GLint			 uni_sampler_loc = -1;
	GLuint			 vao_id			 = 0;

	try
	{
		/* Tesselation patch set up */
		gl.patchParameteri(GL_PATCH_VERTICES, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "PatchParameteri");

		/* Prepare VAO */
		gl.genVertexArrays(1, &vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");

		gl.bindVertexArray(vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArray");

		/* Prepare FBO */
		gl.genFramebuffers(1, &fb_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenFramebuffers");

		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fb_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

		gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, dst_texture_id, 0 /* level */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture");

		gl.viewport(0 /* x */, 0 /* y */, m_width, m_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

		/* Set program */
		gl.useProgram(program_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

		/* Get uniform location and bind texture to proper texture unit */
		uni_sampler_loc = gl.getUniformLocation(program_id, "uni_sampler");
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

		gl.activeTexture(GL_TEXTURE0 + m_texture_unit);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

		gl.bindTexture(GL_TEXTURE_2D, src_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.uniform1i(uni_sampler_loc, m_texture_unit);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		/* Draw */
		gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

		/* Sync */
		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");
	}
	catch (std::exception& exc)
	{
		gl.bindVertexArray(0);
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
		gl.bindTexture(GL_TEXTURE_2D, 0);

		if (0 != vao_id)
		{
			gl.deleteVertexArrays(1, &vao_id);
		}

		if (0 != fb_id)
		{
			gl.deleteFramebuffers(1, &fb_id);
		}

		throw exc;
	}

	gl.bindVertexArray(0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindTexture(GL_TEXTURE_2D, 0);

	if (0 != vao_id)
	{
		gl.deleteVertexArrays(1, &vao_id);
	}

	if (0 != fb_id)
	{
		gl.deleteFramebuffers(1, &fb_id);
	}
}